

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
PlanningUnitMADPDiscrete::JointToIndividualPolicyDomainIndicesRef
          (PlanningUnitMADPDiscrete *this,Index jdI,PolicyDomainCategory cat)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  E *this_00;
  
  if (cat == OHIST_INDEX) {
    pvVar1 = JointToIndividualObservationHistoryIndicesRef(this,jdI);
    return pvVar1;
  }
  if (cat == AOHIST_INDEX) {
    pvVar1 = JointToIndividualActionObservationHistoryIndicesRef(this,(ulong)jdI);
    return pvVar1;
  }
  if (cat == TYPE_INDEX) {
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,
         "JointToIndividualPolicyDomainIndicesRef: types are not a valid policy domain for a PlanningUnitMADPDiscrete"
        );
  }
  else {
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,
         "JointToIndividualPolicyDomainIndicesRef: incorrect JointPolicyDiscrete::PolicyGlobals::PolicyDomainCategory"
        );
  }
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

const vector<Index>& PlanningUnitMADPDiscrete::JointToIndividualPolicyDomainIndicesRef( 
    Index jdI, PolicyGlobals::PolicyDomainCategory cat) const
{
    switch ( cat )
    {
    case PolicyGlobals::OHIST_INDEX :
        return JointToIndividualObservationHistoryIndicesRef(jdI);
        break;
    case PolicyGlobals::AOHIST_INDEX :
        return JointToIndividualActionObservationHistoryIndicesRef(jdI);
        break;
    case PolicyGlobals::TYPE_INDEX : 
        throw(E("JointToIndividualPolicyDomainIndicesRef: types are not a valid policy domain for a PlanningUnitMADPDiscrete"));
        break;
    default:
        throw(E("JointToIndividualPolicyDomainIndicesRef: incorrect JointPolicyDiscrete::PolicyGlobals::PolicyDomainCategory"));
        break;
    }
}